

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer ppVar5;
  pointer ppVar6;
  bool bVar7;
  path *ppVar8;
  basic_ostream<char,_std::char_traits<char>_> *pbVar9;
  long lVar10;
  ostream *poVar11;
  pointer pdVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  path *d;
  double *pdVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  vector<double,_std::allocator<double>_> v;
  recursive_directory_iterator __end1;
  string output_dir;
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> data_files
  ;
  string mkdir_command;
  vector<double,_std::allocator<double>_> v2;
  ofstream output_file;
  ifstream f;
  double local_568;
  double local_560;
  vector<double,_std::allocator<double>_> local_558;
  double local_540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  double local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  vector<double,_std::allocator<double>_> local_4b0;
  recursive_directory_iterator local_498;
  double local_488;
  recursive_directory_iterator local_480;
  istream_iterator<double,_char,_std::char_traits<char>,_long> local_470;
  istream_iterator<double,_char,_std::char_traits<char>,_long> local_458;
  undefined1 local_438 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_430;
  ios_base local_340 [264];
  path local_238 [13];
  
  local_4e8.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_start = (path *)0x0;
  local_4e8.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_finish = (path *)0x0;
  local_4e8.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_438 = (undefined1  [8])getenv("HOME");
  std::filesystem::__cxx11::path::path<char*,std::filesystem::__cxx11::path>
            (local_238,(char **)local_438,auto_format);
  std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
            ((recursive_directory_iterator *)&local_508,local_238,none,(error_code *)0x0);
  std::filesystem::__cxx11::path::~path(local_238);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_508._M_string_length ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_4d0._M_string_length = 0;
  }
  else {
    local_4d0._M_string_length = local_508._M_string_length;
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_508._M_string_length + 8) = *(int *)(local_508._M_string_length + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_508._M_string_length + 8) = *(int *)(local_508._M_string_length + 8) + 1;
    }
  }
  local_4d0._M_dataplus._M_p = local_508._M_dataplus._M_p;
  local_498._M_dirs._M_ptr = (element_type *)0x0;
  local_498._M_dirs._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator(&local_498);
  local_480._M_dirs._M_ptr = (element_type *)local_508._M_dataplus._M_p;
  local_480._M_dirs._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_508._M_string_length;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_508._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_508._M_string_length + 8) = *(int *)(local_508._M_string_length + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_508._M_string_length + 8) = *(int *)(local_508._M_string_length + 8) + 1;
    }
  }
  local_538._M_dataplus._M_p = (pointer)0x0;
  local_538._M_string_length = 0;
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator(&local_480);
  paVar1 = &local_238[0]._M_pathname.field_2;
  while (local_4d0._M_string_length != local_538._M_string_length) {
    ppVar8 = (path *)std::filesystem::__cxx11::recursive_directory_iterator::operator*
                               ((recursive_directory_iterator *)&local_4d0);
    pcVar2 = (ppVar8->_M_pathname)._M_dataplus._M_p;
    local_238[0]._M_pathname._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_238,pcVar2,pcVar2 + (ppVar8->_M_pathname)._M_string_length);
    local_438 = (undefined1  [8])local_238[0]._M_pathname._M_string_length;
    local_430 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238[0]._M_pathname._M_dataplus._M_p;
    bVar7 = std::basic_string_view<char,_std::char_traits<char>_>::ends_with
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_438,
                       "_rse_workshop.dat");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238[0]._M_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(local_238[0]._M_pathname._M_dataplus._M_p,
                      local_238[0]._M_pathname.field_2._M_allocated_capacity + 1);
    }
    if (bVar7) {
      std::vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>::
      emplace_back<std::filesystem::__cxx11::path_const&>
                ((vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>
                  *)&local_4e8,ppVar8);
    }
    std::filesystem::__cxx11::recursive_directory_iterator::operator++
              ((recursive_directory_iterator *)&local_4d0);
  }
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)&local_538);
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)&local_4d0);
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)&local_508);
  ppVar6 = local_4e8.
           super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar5 = local_4e8.
           super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_4e8.
      super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_4e8.
      super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar14 = ((long)local_4e8.
                    super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_4e8.
                    super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
    lVar10 = 0x3f;
    if (uVar14 != 0) {
      for (; uVar14 >> lVar10 == 0; lVar10 = lVar10 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::filesystem::__cxx11::path*,std::vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_4e8.
               super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_4e8.
               super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::filesystem::__cxx11::path*,std::vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (ppVar5,ppVar6);
    ppVar5 = local_4e8.
             super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar8 = local_4e8.
                  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppVar8 != ppVar5; ppVar8 = ppVar8 + 1)
    {
      pbVar9 = std::filesystem::__cxx11::operator<<
                         ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,ppVar8);
      std::ios::widen((char)*(undefined8 *)(*(long *)pbVar9 + -0x18) + (char)pbVar9);
      std::ostream::put((char)pbVar9);
      std::ostream::flush();
    }
  }
  std::ifstream::ifstream
            (local_238,
             ((local_4e8.
               super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_pathname)._M_dataplus._M_p,_S_in);
  local_470._M_ok = true;
  local_470._M_stream = (istream_type *)local_238;
  std::istream_iterator<double,_char,_std::char_traits<char>,_long>::_M_read(&local_470);
  local_458._M_stream = (istream_type *)0x0;
  local_458._M_value = 0.0;
  local_458._M_ok = false;
  std::vector<double,std::allocator<double>>::
  vector<std::istream_iterator<double,char,std::char_traits<char>,long>,void>
            ((vector<double,std::allocator<double>> *)&local_558,&local_470,&local_458,
             (allocator_type *)local_438);
  local_540 = std::
              reduce<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double,std::plus<void>>
                        (0,local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start,
                         local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish);
  lVar10 = (long)local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  auVar22._8_4_ =
       (int)((long)local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 0x23);
  auVar22._0_8_ = lVar10;
  auVar22._12_4_ = 0x45300000;
  local_540 = local_540 /
              ((auVar22._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0));
  dVar17 = std::
           transform_reduce<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double,std::plus<void>,std::multiplies<void>>
                     (0,local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                      local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish,
                      local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
  lVar10 = (long)local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  auVar20._8_4_ =
       (int)((long)local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 0x23);
  auVar20._0_8_ = lVar10;
  auVar20._12_4_ = 0x45300000;
  dVar17 = dVar17 / ((auVar20._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0)) -
           local_540 * local_540;
  if (dVar17 < 0.0) {
    dVar18 = sqrt(dVar17);
  }
  else {
    dVar18 = SQRT(dVar17);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"mean:   ",8);
  poVar11 = std::ostream::_M_insert<double>(local_540);
  local_438[0] = (allocator_type)0xa;
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_438,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"var:    ",8);
  poVar11 = std::ostream::_M_insert<double>(dVar17);
  local_438[0] = (allocator_type)0xa;
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_438,1);
  pdVar12 = local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish;
  dVar17 = 0.0;
  pdVar16 = local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  for (lVar10 = (long)local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start; 0x18 < lVar10; lVar10 = lVar10 + -0x20) {
    local_510 = pow((*pdVar16 - local_540) / dVar18,3.0);
    dVar19 = pow((pdVar16[1] - local_540) / dVar18,3.0);
    local_510 = dVar19 + local_510;
    local_488 = pow((pdVar16[2] - local_540) / dVar18,3.0);
    dVar19 = pow((pdVar16[3] - local_540) / dVar18,3.0);
    dVar17 = dVar17 + dVar19 + local_488 + local_510;
    pdVar16 = pdVar16 + 4;
  }
  for (; pdVar4 = local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish,
      pdVar3 = local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start, pdVar16 != pdVar12; pdVar16 = pdVar16 + 1) {
    dVar19 = pow((*pdVar16 - local_540) / dVar18,3.0);
    dVar17 = dVar17 + dVar19;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"skew:   ",8);
  lVar10 = (long)pdVar4 - (long)pdVar3 >> 3;
  auVar21._8_4_ = (int)((long)pdVar4 - (long)pdVar3 >> 0x23);
  auVar21._0_8_ = lVar10;
  auVar21._12_4_ = 0x45300000;
  poVar11 = std::ostream::_M_insert<double>
                      (dVar17 / ((auVar21._8_8_ - 1.9342813113834067e+25) +
                                ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0)));
  local_438[0] = (allocator_type)0xa;
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_438,1);
  lVar10 = std::chrono::_V2::system_clock::now();
  std::vector<double,_std::allocator<double>_>::vector(&local_4b0,&local_558);
  pdVar3 = local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar12 = local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar14 = (long)local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    lVar13 = 0x3f;
    if (uVar14 != 0) {
      for (; uVar14 >> lVar13 == 0; lVar13 = lVar13 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar13 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pdVar12,pdVar3);
    pdVar12 = local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  dVar17 = local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start
           [(int)((ulong)((long)pdVar12 -
                         (long)local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start) >> 4)];
  lVar13 = std::chrono::_V2::system_clock::now();
  *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) =
       *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"median took ",0xc);
  poVar11 = std::ostream::_M_insert<double>((double)(lVar13 - lVar10) / 1000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11," ms\n",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"median: ",8);
  poVar11 = std::ostream::_M_insert<double>(dVar17);
  local_438[0] = (allocator_type)0xa;
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_438,1);
  if ((long)local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    lVar10 = (long)local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    lVar13 = 0;
    do {
      lVar13 = lVar13 + 1;
    } while (lVar10 + (ulong)(lVar10 == 0) != lVar13);
  }
  *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) =
       *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) | 1;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Any greater than 50? ",0x15);
  poVar11 = std::ostream::_M_insert<bool>(true);
  local_438[0] = (allocator_type)0xa;
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_438,1);
  iVar15 = 0;
  lVar10 = 0;
  do {
    local_568 = dVar17;
    local_560 = dVar18 + dVar18;
    if (((long)local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start >> 3) + -1 == lVar10) goto LAB_00103142;
    lVar13 = lVar10 + 1;
    local_568 = local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar10];
    local_560 = local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar10 + 1];
    lVar10 = lVar13;
  } while (ABS(local_560 - local_568) <= dVar18 + dVar18);
  iVar15 = (int)lVar13 + -1;
LAB_00103142:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Position ",9);
  poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar15);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,", first ",8);
  poVar11 = std::ostream::_M_insert<double>(local_568);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11," second: ",9);
  poVar11 = std::ostream::_M_insert<double>(local_560);
  local_438[0] = (allocator_type)0xa;
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_438,1);
  local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"./output","");
  std::operator+(&local_4d0,"mkdir -p ",&local_508);
  system(local_4d0._M_dataplus._M_p);
  local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_538,local_508._M_dataplus._M_p,
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (local_508._M_string_length + (long)local_508._M_dataplus._M_p));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_538,"/results.dat");
  std::ofstream::ofstream(local_438,(string *)&local_538,_S_out);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538._M_dataplus._M_p != &local_538.field_2) {
    operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
  }
  std::ostream::_M_insert<double>
            (*local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start);
  if (8 < (ulong)((long)local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start)) {
    uVar14 = 1;
    do {
      local_538._M_dataplus._M_p._0_1_ = 0x2c;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,(char *)&local_538,1);
      std::ostream::_M_insert<double>
                (local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar14]);
      uVar14 = uVar14 + 1;
    } while (uVar14 < (ulong)((long)local_558.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_558.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  std::ofstream::close();
  local_438 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_438 + *(long *)(_VTT + -0x18)) = _sqrt;
  std::filebuf::~filebuf((filebuf *)&local_430);
  std::ios_base::~ios_base(local_340);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
    operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
  }
  if (local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::ifstream::~ifstream(local_238);
  std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
  ~vector(&local_4e8);
  return 0;
}

Assistant:

int main()
{
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 1. Reading some data in from a file
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    // Find all files like *_rse_workshop.dat under a specific directory
    std::vector<fs::path> data_files;
    for (auto &p : fs::recursive_directory_iterator(std::getenv("HOME")))
    {
        if (p.path().string().ends_with("_rse_workshop.dat"))
        {
            data_files.emplace_back(p.path());
        }
    }

    // This is just to make sure the same file is first, so the numbers later are the same on each version.
    // The sort isn't necessary!
    std::sort(data_files.begin(), data_files.end());

    // Which data files did we find? (range-for loop)
    for (const auto &d : data_files)
    {
        std::cout << d << std::endl;
    }


    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 2. Calculate the mean and standard deviation of some data
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    // Read some data in
    std::ifstream f(data_files[0]);
    std::vector<double> v{std::istream_iterator<double>(f), std::istream_iterator<double>()};

    const double mean = std::reduce(v.begin(), v.end(), 0.0) / v.size();
    const double var = std::transform_reduce(v.begin(), v.end(), v.begin(), 0.0) / v.size() - mean * mean;
    const double std = std::sqrt(var);

    std::cout << "mean:   " << mean << '\n';
    std::cout << "var:    " << var << '\n';


    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 3. Calculate the skewness - there's no default algorithm for that!
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    // Compute skewness
    auto third_moment = [mean, std](const double x) { return std::pow((x - mean) / std, 3); };
    const double skew = std::transform_reduce(v.begin(), v.end(), 0.0, std::plus<>(), third_moment) / v.size();

    std::cout << "skew:   " << skew << '\n';


    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 4. Calculate the median (and bonus chrono)
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    auto t1 = std::chrono::high_resolution_clock::now();

    // Take a copy of the vector so we can sort it
    std::vector<double> v2 = v;

    std::sort(v2.begin(), v2.end());
    int half_way = v2.size() / 2;
    const double median = v2[half_way];

    auto t2 = std::chrono::high_resolution_clock::now();
    std::chrono::duration<double, std::milli> ms = t2 - t1;
    std::cout << std::fixed << "median took " << ms.count() << " ms\n";

    std::cout << "median: " << median << '\n';


    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 5. What other algorithms are there?
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    // Are any of the elements > 50?
    bool any_greater_than_50 = false;

    for (int i = 0; i < v.size(); i++)
    {
        if (v[i] > 50.0)
        {
            any_greater_than_50 = true;
        }
    }
    std::cout << std::boolalpha << "Any greater than 50? " << any_greater_than_50 << '\n';

    // First position where consecutive elements differ by more than twice the standard deviation
    int dist = 0;
    double first, second;
    for (int i = 0; i < v.size() - 1; i++)
    {
        if (std::fabs(v[i + 1] - v[i]) > 2 * std)
        {
            dist = i;
            first = v[i];
            second = v[i + 1];
            break;
        }
    }
    std::cout << "Position " << dist << ", first " << first << " second: " << second << '\n';


    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 7. Writing some data back out to a csv file - pulling several concepts together
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    std::string output_dir = "./output";
    std::string mkdir_command = "mkdir -p " + output_dir;
    // System takes a const char* as a parameter
    system(mkdir_command.c_str());

    // Create an output file
    std::ofstream output_file(output_dir + "/results.dat");
    output_file << v[0];
    for (int i = 1; i < v.size(); i++)
    {
        output_file << ',' << v[i];
    }
    output_file.close();
}